

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReduceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *layer_00;
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  ReduceLayerParams_ReduceAxis RVar4;
  Tensor *this_00;
  ReduceLayerParams *this_01;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string err;
  bool sufficientInputRank;
  int rank;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  local_39 = 0;
  validateOutputCount(__return_storage_ptr__,local_20,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_39 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_39 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  if (((this->ndArrayInterpretation & 1U) == 0) ||
     (iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(local_20), layer_00 = local_20,
     iVar2 < 1)) goto LAB_00484f54;
  local_3a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rank,"Reduce",(allocator<char> *)&sufficientInputRank);
  validateInputOutputRankEquality
            (__return_storage_ptr__,layer_00,(string *)&rank,&this->blobNameToRank);
  std::__cxx11::string::~string((string *)&rank);
  std::allocator<char>::~allocator((allocator<char> *)&sufficientInputRank);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_3a = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_3a & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  this_00 = Specification::NeuralNetworkLayer::inputtensor(local_20,0);
  uVar3 = Specification::Tensor::rank(this_00);
  err.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)local_90);
  this_01 = Specification::NeuralNetworkLayer::reduce(local_20);
  RVar4 = Specification::ReduceLayerParams::axis(this_01);
  if (RVar4 == ReduceLayerParams_ReduceAxis_CHW) {
    if ((int)uVar3 < 3) {
      err.field_2._M_local_buf[0xf] = '\0';
    }
LAB_00484e21:
    if ((err.field_2._M_local_buf[0xf] & 1U) == 0) {
      psVar5 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::__cxx11::string::string((string *)&local_150,(string *)psVar5);
      std::operator+(&local_130,"Reduce layer \'",&local_150);
      std::operator+(&local_110,&local_130,
                     "\': input\'s rank is smaller than the dimensions provided in the axis parameter"
                    );
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_90);
      local_38 = 1;
    }
    else {
      local_38 = 0;
    }
  }
  else {
    if (RVar4 == ReduceLayerParams_ReduceAxis_HW) {
      if ((int)uVar3 < 2) {
        err.field_2._M_local_buf[0xf] = '\0';
      }
      goto LAB_00484e21;
    }
    if (RVar4 == ReduceLayerParams_ReduceAxis_C) {
      if ((int)uVar3 < 1) {
        err.field_2._M_local_buf[0xf] = '\0';
      }
      goto LAB_00484e21;
    }
    if (RVar4 == ReduceLayerParams_ReduceAxis_H) {
      if ((int)uVar3 < 1) {
        err.field_2._M_local_buf[0xf] = '\0';
      }
      goto LAB_00484e21;
    }
    if (RVar4 == ReduceLayerParams_ReduceAxis_W) {
      if ((int)uVar3 < 1) {
        err.field_2._M_local_buf[0xf] = '\0';
      }
      goto LAB_00484e21;
    }
    if (RVar4 != 
        ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_)
    goto LAB_00484e21;
    psVar5 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::__cxx11::string::string((string *)&local_f0,(string *)psVar5);
    std::operator+(&local_d0,"Reduce layer: \'",&local_f0);
    std::operator+(&local_b0,&local_d0,"\': unknown value for parameter \'axis\'.");
    std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_90);
    local_38 = 1;
  }
  std::__cxx11::string::~string((string *)local_90);
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
LAB_00484f54:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReduceLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Reduce", blobNameToRank));

        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.reduce().axis()) {
            case Specification::ReduceLayerParams::CHW:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::HW:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::H:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::W:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::C:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_:
                err = "Reduce layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Reduce layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimensions provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}